

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_memio.h
# Opt level: O3

bool __thiscall ASDCP::MXF::RIP::PartitionPair::Unarchive(PartitionPair *this,MemIOReader *Reader)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  
  if ((ulong)*(uint *)(Reader + 0xc) + 4 <= (ulong)*(uint *)(Reader + 8)) {
    lVar3 = *(long *)Reader;
    uVar1 = *(uint *)(lVar3 + (ulong)*(uint *)(Reader + 0xc));
    this->BodySID = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    iVar2 = *(int *)(Reader + 0xc);
    uVar1 = iVar2 + 4;
    *(uint *)(Reader + 0xc) = uVar1;
    if ((ulong)uVar1 + 8 <= (ulong)*(uint *)(Reader + 8)) {
      uVar4 = *(ulong *)(lVar3 + (ulong)uVar1);
      this->ByteOffset =
           uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
           (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
           (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
      *(int *)(Reader + 0xc) = iVar2 + 0xc;
      return true;
    }
  }
  return false;
}

Assistant:

inline bool ReadUi32BE(ui32_t* i) {
	assert(i);
	if ( ( m_size + sizeof(ui32_t) ) > m_capacity )
	  return false;

	*i = KM_i32_BE(cp2i<ui32_t>(m_p + m_size));
	m_size += sizeof(ui32_t);
	return true;
      }